

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

ssl_primary_config * Curl_ssl_cf_get_primary_config(Curl_cfilter *cf)

{
  return (ssl_primary_config *)
         (&cf->conn->shutdown_poll + (ulong)((~cf->cft->flags & 10U) == 0) * 4 + 1);
}

Assistant:

struct ssl_primary_config *
Curl_ssl_cf_get_primary_config(struct Curl_cfilter *cf)
{
#ifdef CURL_DISABLE_PROXY
  return &cf->conn->ssl_config;
#else
  return Curl_ssl_cf_is_proxy(cf) ?
    &cf->conn->proxy_ssl_config : &cf->conn->ssl_config;
#endif
}